

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

int despot::Variable::ComputeCurrentIndex
              (vector<despot::Variable_*,_std::allocator<despot::Variable_*>_> *vars)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = *(long *)(vars + 8) - *(long *)vars;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    lVar4 = 0;
    iVar2 = 0;
    do {
      lVar1 = *(long *)(*(long *)vars + lVar4 * 8);
      iVar2 = (int)((ulong)(*(long *)(lVar1 + 0x10) - *(long *)(lVar1 + 8)) >> 5) * iVar2 +
              *(int *)(lVar1 + 0x50);
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
    return iVar2;
  }
  return 0;
}

Assistant:

int Variable::ComputeCurrentIndex(const vector<Variable*>& vars) {
	int index = 0;
	for (int i = 0; i < vars.size(); i++) {
		Variable* var = vars[i];
		index = index * var->Size() + var->curr_value;
	}
	return index;
}